

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>(string_view data,size_t extra)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  anon_unknown_0 *this;
  size_t in_R8;
  string_view sVar4;
  size_t local_68;
  char *local_60;
  size_t local_58;
  size_type local_50;
  CordRepFlat *local_48;
  CordRepFlat *flat;
  size_t cap;
  size_t end;
  size_t length;
  CordRepBtree *leaf;
  size_t extra_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  extra_local = data._M_len;
  leaf = (CordRepBtree *)extra;
  length = (size_t)New(0);
  end = 0;
  cap = 0;
  flat = (CordRepFlat *)capacity((CordRepBtree *)length);
  while (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                           ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local),
        !bVar1 && (CordRepFlat *)cap != flat) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    local_48 = CordRepFlat::New((size_t)((leaf->super_CordRep).storage + (sVar2 - 0xd)));
    local_50 = std::basic_string_view<char,_std::char_traits<char>_>::length
                         ((basic_string_view<char,_std::char_traits<char>_> *)&extra_local);
    local_58 = CordRepFlat::Capacity(local_48);
    puVar3 = std::min<unsigned_long>(&local_50,&local_58);
    (local_48->super_CordRep).length = *puVar3;
    end = (local_48->super_CordRep).length + end;
    *(CordRepFlat **)(length + 0x10 + cap * 8) = local_48;
    cap = cap + 1;
    this = (anon_unknown_0 *)CordRepFlat::Data(local_48);
    sVar4._M_str = (char *)(local_48->super_CordRep).length;
    sVar4._M_len = data_local._M_len;
    sVar4 = cord_internal::anon_unknown_0::
            Consume<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                      (this,(char *)extra_local,sVar4,in_R8);
    local_68 = sVar4._M_len;
    extra_local = local_68;
    local_60 = sVar4._M_str;
    data_local._M_len = (size_t)local_60;
  }
  *(size_t *)length = end;
  set_end((CordRepBtree *)length,cap);
  return (CordRepBtree *)length;
}

Assistant:

CordRepBtree* CordRepBtree::NewLeaf<kBack>(absl::string_view data,
                                           size_t extra) {
  CordRepBtree* leaf = CordRepBtree::New(0);
  size_t length = 0;
  size_t end = 0;
  const size_t cap = leaf->capacity();
  while (!data.empty() && end != cap) {
    auto* flat = CordRepFlat::New(data.length() + extra);
    flat->length = (std::min)(data.length(), flat->Capacity());
    length += flat->length;
    leaf->edges_[end++] = flat;
    data = Consume<kBack>(flat->Data(), data, flat->length);
  }
  leaf->length = length;
  leaf->set_end(end);
  return leaf;
}